

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

void __thiscall roaring::Roaring64Map::addMany(Roaring64Map *this,size_t n_args,uint64_t *vals)

{
  uint64_t uVar1;
  Roaring64Map *pRVar2;
  roaring_bitmap_t *r;
  key_type kVar3;
  size_t sVar4;
  key_type kVar5;
  key_type local_54;
  roaring_bulk_context_t local_50;
  Roaring64Map *local_40;
  uint64_t *local_38;
  
  local_50.idx = 0;
  local_50.key = 0;
  local_50.typecode = '\0';
  local_50.container._0_7_ = 0;
  local_50.container._7_1_ = 0;
  if (n_args != 0) {
    r = (roaring_bitmap_t *)0x0;
    kVar3 = 0;
    sVar4 = 0;
    local_40 = this;
    local_38 = vals;
    do {
      pRVar2 = local_40;
      uVar1 = local_38[sVar4];
      kVar5 = (key_type)(uVar1 >> 0x20);
      if ((r == (roaring_bitmap_t *)0x0) || (kVar3 != kVar5)) {
        local_54 = kVar5;
        r = (roaring_bitmap_t *)
            std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::operator[](&local_40->roarings,&local_54);
        (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | pRVar2->copyOnWrite;
        local_50.container._0_7_ = 0;
        local_50.container._7_1_ = 0;
        local_50.idx = 0;
        local_50.key = 0;
        local_50.typecode = '\0';
        kVar3 = kVar5;
      }
      roaring_bitmap_add_bulk(r,&local_50,(uint32_t)uVar1);
      sVar4 = sVar4 + 1;
    } while (n_args != sVar4);
  }
  return;
}

Assistant:

void addMany(size_t n_args, const uint64_t *vals) {
        // Potentially reduce outer map lookups by optimistically
        // assuming that adjacent values will belong to the same inner bitmap.
        Roaring *last_inner_bitmap = nullptr;
        uint32_t last_value_high = 0;
        BulkContext last_bulk_context;
        for (size_t lcv = 0; lcv < n_args; lcv++) {
            auto value = vals[lcv];
            auto value_high = highBytes(value);
            auto value_low = lowBytes(value);
            if (last_inner_bitmap == nullptr || value_high != last_value_high) {
                last_inner_bitmap = &lookupOrCreateInner(value_high);
                last_value_high = value_high;
                last_bulk_context = BulkContext{};
            }
            last_inner_bitmap->addBulk(last_bulk_context, value_low);
        }
    }